

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

boolean match_warn_of_mon(monst *mon)

{
  bool local_29;
  artifact *local_28;
  artifact *arti;
  monst *mon_local;
  
  if ((uwep != (obj *)0x0) && (uwep->oartifact != '\0')) {
    if ((uwep == (obj *)0x0) || (uwep->oartifact == '\0')) {
      local_28 = (artifact *)0x0;
    }
    else {
      local_28 = artilist + (int)uwep->oartifact;
    }
    if ((((local_28->spfx & 0x8000000) != 0) && (local_28->mtype != 0)) &&
       (local_28->mtype == (long)mon->data->mlet)) {
      return '\x01';
    }
  }
  if (((u.uprops[0x41].intrinsic != 0) || (local_29 = false, u.uprops[0x41].extrinsic != 0)) &&
     (local_29 = false, flags.warntype != 0)) {
    local_29 = (flags.warntype & mon->data->mflags2) != 0;
  }
  return local_29;
}

Assistant:

boolean match_warn_of_mon(const struct monst *mon)
{
	/* warned of S_MONSTER? */
	if (uwep && uwep->oartifact) {
	    const struct artifact *arti = get_artifact(uwep);
	    if (arti->spfx & SPFX_WARN_S &&
		arti->mtype && arti->mtype == mon->data->mlet) {
		return TRUE;
	    }
	}

	return Warn_of_mon && flags.warntype &&
	       (flags.warntype & mon->data->mflags2);
}